

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::~SPxSolverBase(SPxSolverBase<double> *this)

{
  undefined8 *in_RDI;
  SPxLPBase<double> *in_stack_ffffffffffffffe0;
  
  *in_RDI = &PTR__SPxSolverBase_004ebaf0;
  in_RDI[0x19] = &PTR__SPxSolverBase_004ebfb0;
  in_RDI[0x39] = &DAT_004ebfd0;
  if ((*(byte *)(in_RDI + 0x7c) & 1) != 0) {
    if ((long *)in_RDI[0xf4] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[0xf4] + 0xa8))();
    }
    in_RDI[0xf4] = 0;
  }
  if ((*(byte *)((long)in_RDI + 0x3e1) & 1) != 0) {
    in_stack_ffffffffffffffe0 = (SPxLPBase<double> *)in_RDI[0xf5];
    if (in_stack_ffffffffffffffe0 != (SPxLPBase<double> *)0x0) {
      (*(_func_int *)
        (((_Vector_impl *)
         &(in_stack_ffffffffffffffe0->super_LPRowSetBase<double>).super_SVSetBase<double>.
          super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)->super__Vector_impl_data).
        _M_start[0xb])();
    }
    in_RDI[0xf5] = 0;
  }
  if ((*(byte *)((long)in_RDI + 0x3e2) & 1) != 0) {
    if ((long *)in_RDI[0xf6] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[0xf6] + 8))();
    }
    in_RDI[0xf6] = 0;
  }
  (*(code *)**(undefined8 **)in_RDI[0x5f])();
  (*(code *)**(undefined8 **)in_RDI[0x11d])();
  (*(code *)**(undefined8 **)in_RDI[0x11e])();
  (*(code *)**(undefined8 **)in_RDI[0x11f])();
  (*(code *)**(undefined8 **)in_RDI[0x120])();
  spx_free<soplex::Timer*>((Timer **)0x238cdd);
  spx_free<soplex::Timer*>((Timer **)0x238cee);
  spx_free<soplex::Timer*>((Timer **)0x238cff);
  spx_free<soplex::Timer*>((Timer **)0x238d10);
  spx_free<soplex::Timer*>((Timer **)0x238d21);
  DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffffe0);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238d43);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238d54);
  DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffffe0);
  DataArray<int>::~DataArray((DataArray<int> *)in_stack_ffffffffffffffe0);
  DIdxSet::~DIdxSet((DIdxSet *)in_stack_ffffffffffffffe0);
  DIdxSet::~DIdxSet((DIdxSet *)in_stack_ffffffffffffffe0);
  DIdxSet::~DIdxSet((DIdxSet *)in_stack_ffffffffffffffe0);
  DIdxSet::~DIdxSet((DIdxSet *)in_stack_ffffffffffffffe0);
  Random::~Random((Random *)(in_RDI + 0xfa));
  DSVectorBase<double>::~DSVectorBase((DSVectorBase<double> *)in_stack_ffffffffffffffe0);
  DSVectorBase<double>::~DSVectorBase((DSVectorBase<double> *)in_stack_ffffffffffffffe0);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238dfe);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238e0f);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238e20);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238e31);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238e42);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238e53);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238e64);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238e75);
  UpdateVector<double>::~UpdateVector((UpdateVector<double> *)in_stack_ffffffffffffffe0);
  UpdateVector<double>::~UpdateVector((UpdateVector<double> *)in_stack_ffffffffffffffe0);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238ea8);
  UpdateVector<double>::~UpdateVector((UpdateVector<double> *)in_stack_ffffffffffffffe0);
  VectorBase<double>::~VectorBase((VectorBase<double> *)0x238eca);
  Array<soplex::UnitVectorBase<double>_>::~Array((Array<soplex::UnitVectorBase<double>_> *)0x238edb)
  ;
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::~DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_ffffffffffffffe0);
  DataArray<soplex::SPxSolverBase<double>::VarStatus>::~DataArray
            ((DataArray<soplex::SPxSolverBase<double>::VarStatus> *)in_stack_ffffffffffffffe0);
  SPxBasisBase<double>::~SPxBasisBase((SPxBasisBase<double> *)in_stack_ffffffffffffffe0);
  SPxLPBase<double>::~SPxLPBase(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

SPxSolverBase<R>::~SPxSolverBase()
   {
      assert(!freePricer || thepricer != nullptr);
      assert(!freeRatioTester || theratiotester != nullptr);
      assert(!freeStarter || thestarter != nullptr);

      if(freePricer)
      {
         delete thepricer;
         thepricer = nullptr;
      }

      if(freeRatioTester)
      {
         delete theratiotester;
         theratiotester = nullptr;
      }

      if(freeStarter)
      {
         delete thestarter;
         thestarter = nullptr;
      }

      // free the timers
      assert(theTime);
      assert(multTimeSparse);
      assert(multTimeFull);
      assert(multTimeColwise);
      assert(multTimeUnsetup);
      theTime->~Timer();
      multTimeSparse->~Timer();
      multTimeFull->~Timer();
      multTimeColwise->~Timer();
      multTimeUnsetup->~Timer();
      spx_free(theTime);
      spx_free(multTimeSparse);
      spx_free(multTimeFull);
      spx_free(multTimeColwise);
      spx_free(multTimeUnsetup);
   }